

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uInput.cpp
# Opt level: O2

void __thiscall
uInputPlus::uInput::send_pos_absolute
          (uInput *this,uInputCoordinate *pos,int32_t mt_slot,bool report)

{
  int32_t val;
  uint16_t code;
  
  if (mt_slot == -1) {
    if (pos->X != 0) {
      emit(this,3,0,pos->X);
    }
    if (pos->Y != 0) {
      emit(this,3,1,pos->Y);
    }
    val = pos->Z;
    if (val == 0) goto LAB_001055ad;
    code = 2;
  }
  else {
    emit(this,3,0x2f,mt_slot);
    if (pos->X != 0) {
      emit(this,3,0x35,pos->X);
    }
    val = pos->Y;
    if (val == 0) goto LAB_001055ad;
    code = 0x36;
  }
  emit(this,3,code,val);
LAB_001055ad:
  if (report) {
    emit(this,0,0,0);
    return;
  }
  return;
}

Assistant:

void uInput::send_pos_absolute(const uInputCoordinate &pos, int32_t mt_slot, bool report) const {
	if (mt_slot == -1) {
		if (pos.X)
			emit(EV_ABS, ABS_X, pos.X);

		if (pos.Y)
			emit(EV_ABS, ABS_Y, pos.Y);

		if (pos.Z)
			emit(EV_ABS, ABS_Z, pos.Z);
	} else {
		emit(EV_ABS, ABS_MT_SLOT, mt_slot);

		if (pos.X)
			emit(EV_ABS, ABS_MT_POSITION_X, pos.X);

		if (pos.Y)
			emit(EV_ABS, ABS_MT_POSITION_Y, pos.Y);

	}

	if (report)
		emit(EV_SYN, SYN_REPORT, 0);
}